

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O0

VkImageCopy *
vkt::synchronization::anon_unknown_0::CopyBlitImage::makeImageCopyRegion
          (VkImageCopy *__return_storage_ptr__,Resource *resource)

{
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  ImageResource *pIVar4;
  VkOffset3D VVar5;
  VkImageCopy *imageCopyRegion;
  undefined8 local_30;
  deInt32 local_28;
  undefined8 local_20;
  deInt32 local_18;
  Resource *resource_local;
  
  pIVar4 = Resource::getImage(resource);
  dVar1 = (pIVar4->subresourceLayers).mipLevel;
  dVar2 = (pIVar4->subresourceLayers).baseArrayLayer;
  dVar3 = (pIVar4->subresourceLayers).layerCount;
  (__return_storage_ptr__->srcSubresource).aspectMask = (pIVar4->subresourceLayers).aspectMask;
  (__return_storage_ptr__->srcSubresource).mipLevel = dVar1;
  (__return_storage_ptr__->srcSubresource).baseArrayLayer = dVar2;
  (__return_storage_ptr__->srcSubresource).layerCount = dVar3;
  VVar5 = ::vk::makeOffset3D(0,0,0);
  local_18 = VVar5.z;
  (__return_storage_ptr__->srcOffset).z = local_18;
  local_20 = VVar5._0_8_;
  (__return_storage_ptr__->srcOffset).x = (undefined4)local_20;
  (__return_storage_ptr__->srcOffset).y = local_20._4_4_;
  pIVar4 = Resource::getImage(resource);
  dVar1 = (pIVar4->subresourceLayers).mipLevel;
  dVar2 = (pIVar4->subresourceLayers).baseArrayLayer;
  dVar3 = (pIVar4->subresourceLayers).layerCount;
  (__return_storage_ptr__->dstSubresource).aspectMask = (pIVar4->subresourceLayers).aspectMask;
  (__return_storage_ptr__->dstSubresource).mipLevel = dVar1;
  (__return_storage_ptr__->dstSubresource).baseArrayLayer = dVar2;
  (__return_storage_ptr__->dstSubresource).layerCount = dVar3;
  VVar5 = ::vk::makeOffset3D(0,0,0);
  local_30 = VVar5._0_8_;
  (__return_storage_ptr__->dstOffset).x = (undefined4)local_30;
  (__return_storage_ptr__->dstOffset).y = local_30._4_4_;
  local_28 = VVar5.z;
  (__return_storage_ptr__->dstOffset).z = local_28;
  pIVar4 = Resource::getImage(resource);
  dVar1 = (pIVar4->extent).height;
  (__return_storage_ptr__->extent).width = (pIVar4->extent).width;
  (__return_storage_ptr__->extent).height = dVar1;
  (__return_storage_ptr__->extent).depth = (pIVar4->extent).depth;
  return __return_storage_ptr__;
}

Assistant:

VkImageCopy makeImageCopyRegion (const Resource& resource)
{
	const VkImageCopy imageCopyRegion =
	{
		resource.getImage().subresourceLayers,		// VkImageSubresourceLayers    srcSubresource;
		makeOffset3D(0, 0, 0),						// VkOffset3D                  srcOffset;
		resource.getImage().subresourceLayers,		// VkImageSubresourceLayers    dstSubresource;
		makeOffset3D(0, 0, 0),						// VkOffset3D                  dstOffset;
		resource.getImage().extent,					// VkExtent3D                  extent;
	};
	return imageCopyRegion;
}